

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O0

void pelelm_dertransportcoeff
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  int in_EDX;
  long in_RSI;
  long in_R8;
  Real PrInv;
  Real ScInv;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *ltransparm;
  Array4<double> mu;
  Array4<double> lambda;
  Array4<double> rhoD;
  Array4<const_double> rhoY;
  Array4<const_double> T;
  undefined1 local_a98 [32];
  anon_class_344_8_fb1657c5 *in_stack_fffffffffffff588;
  Box *in_stack_fffffffffffff590;
  undefined1 auStack_a58 [64];
  undefined1 auStack_a18 [64];
  undefined1 auStack_9d8 [64];
  undefined1 auStack_998 [64];
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *local_958;
  undefined1 local_950 [64];
  undefined1 auStack_910 [64];
  undefined1 auStack_8d0 [64];
  undefined1 auStack_890 [64];
  undefined1 auStack_850 [64];
  double local_810;
  double local_808;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *local_800;
  double local_7f8;
  double local_7f0;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *local_7e8;
  Array4<double> local_7e0;
  Array4<double> local_7a0;
  Array4<double> local_760;
  Array4<const_double> local_720;
  Array4<const_double> local_6e0;
  long local_690;
  int local_684;
  long local_680;
  Array4<double> local_670;
  int local_62c;
  long local_628;
  Array4<double> local_620;
  int local_5dc;
  long local_5d8;
  Array4<double> local_5d0;
  int local_58c;
  long local_588;
  Array4<const_double> local_580;
  int local_53c;
  long local_538;
  Array4<const_double> local_530;
  int local_4ec;
  Dim3 local_4e0;
  Dim3 local_4d0;
  Dim3 local_4c0;
  Dim3 local_4b0;
  int local_4a4;
  undefined8 *local_4a0;
  double *local_498;
  Dim3 local_490;
  Dim3 local_480;
  Dim3 local_470;
  Dim3 local_460;
  int local_454;
  undefined8 *local_450;
  double *local_448;
  Dim3 local_440;
  undefined8 *local_430;
  undefined4 local_424;
  undefined4 uStack_420;
  int local_41c;
  Dim3 local_418;
  undefined8 *local_408;
  undefined4 local_3fc;
  undefined4 uStack_3f8;
  int local_3f4;
  Dim3 local_3f0;
  undefined8 *local_3e0;
  int local_3d4;
  int iStack_3d0;
  int local_3cc;
  Dim3 local_3c8;
  undefined8 *local_3b8;
  int local_3b0;
  int iStack_3ac;
  int local_3a8;
  undefined4 local_3a4;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  undefined4 local_384;
  int *local_380;
  undefined4 local_374;
  long local_370;
  undefined4 local_364;
  long local_360;
  undefined4 local_354;
  int *local_350;
  undefined4 local_344;
  undefined8 *local_340;
  undefined4 local_334;
  undefined8 *local_330;
  undefined4 local_324;
  undefined8 *local_320;
  undefined4 local_314;
  undefined8 *local_310;
  undefined4 local_304;
  undefined8 *local_300;
  undefined4 local_2f4;
  undefined8 *local_2f0;
  Dim3 local_2e8;
  Dim3 local_2d8;
  Dim3 local_2c8;
  Dim3 local_2b8;
  int local_2ac;
  undefined8 *local_2a8;
  double *local_2a0;
  Dim3 local_298;
  undefined8 *local_288;
  undefined4 local_27c;
  undefined4 uStack_278;
  int local_274;
  Dim3 local_270;
  undefined8 *local_260;
  int local_258;
  int iStack_254;
  int local_250;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  undefined8 *local_218;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  Dim3 local_1f0;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  double *local_1a8;
  Dim3 local_1a0;
  undefined8 *local_190;
  undefined4 local_184;
  undefined4 uStack_180;
  int local_17c;
  Dim3 local_178;
  undefined8 *local_168;
  int local_160;
  int iStack_15c;
  int local_158;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  Dim3 local_f8;
  Dim3 local_e4;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined4 uStack_88;
  int local_84;
  Dim3 local_80;
  undefined8 *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_4ec = 1;
  local_498 = *(double **)(in_R8 + 0x10);
  local_4a0 = (undefined8 *)(in_R8 + 0x18);
  local_4a4 = *(int *)(in_R8 + 0x34);
  local_324 = 0;
  local_3fc = *(undefined4 *)local_4a0;
  local_334 = 1;
  uStack_3f8 = *(undefined4 *)(in_R8 + 0x1c);
  local_4c0._0_8_ = *local_4a0;
  local_344 = 2;
  local_4c0.z = *(int *)(in_R8 + 0x20);
  local_380 = (int *)(in_R8 + 0x24);
  local_384 = 0;
  local_3b0 = *local_380 + 1;
  local_390 = in_R8 + 0x24;
  local_394 = 1;
  iStack_3ac = *(int *)(in_R8 + 0x28) + 1;
  local_3a0 = in_R8 + 0x24;
  local_3a4 = 2;
  local_4e0.z = *(int *)(in_R8 + 0x2c) + 1;
  local_4e0.y = iStack_3ac;
  local_4e0.x = local_3b0;
  local_690 = in_R8;
  local_684 = in_EDX;
  local_680 = in_RSI;
  local_4d0._0_8_ = local_4e0._0_8_;
  local_4d0.z = local_4e0.z;
  local_4b0._0_8_ = local_4c0._0_8_;
  local_4b0.z = local_4c0.z;
  local_418._0_8_ = local_4c0._0_8_;
  local_418.z = local_4c0.z;
  local_408 = local_4a0;
  local_3f4 = local_4c0.z;
  local_3c8._0_8_ = local_4e0._0_8_;
  local_3c8.z = local_4e0.z;
  local_3b8 = local_4a0;
  local_3a8 = local_4e0.z;
  local_340 = local_4a0;
  local_330 = local_4a0;
  local_320 = local_4a0;
  amrex::Array4<const_double>::Array4(&local_530,local_498,&local_4b0,&local_4d0,local_4a4);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_6e0,&local_530,local_4ec);
  local_538 = local_690;
  local_53c = 2;
  local_448 = *(double **)(local_690 + 0x10);
  local_450 = (undefined8 *)(local_690 + 0x18);
  local_454 = *(int *)(local_690 + 0x34);
  local_2f4 = 0;
  local_424 = *(undefined4 *)local_450;
  local_304 = 1;
  uStack_420 = *(undefined4 *)(local_690 + 0x1c);
  local_470._0_8_ = *local_450;
  local_314 = 2;
  local_470.z = *(int *)(local_690 + 0x20);
  local_350 = (int *)(local_690 + 0x24);
  local_354 = 0;
  local_3d4 = *local_350 + 1;
  local_360 = local_690 + 0x24;
  local_364 = 1;
  iStack_3d0 = *(int *)(local_690 + 0x28) + 1;
  local_370 = local_690 + 0x24;
  local_374 = 2;
  local_490.z = *(int *)(local_690 + 0x2c) + 1;
  local_490.y = iStack_3d0;
  local_490.x = local_3d4;
  local_480._0_8_ = local_490._0_8_;
  local_480.z = local_490.z;
  local_460._0_8_ = local_470._0_8_;
  local_460.z = local_470.z;
  local_440._0_8_ = local_470._0_8_;
  local_440.z = local_470.z;
  local_430 = local_450;
  local_41c = local_470.z;
  local_3f0._0_8_ = local_490._0_8_;
  local_3f0.z = local_490.z;
  local_3e0 = local_450;
  local_3cc = local_490.z;
  local_310 = local_450;
  local_300 = local_450;
  local_2f0 = local_450;
  amrex::Array4<const_double>::Array4(&local_580,local_448,&local_460,&local_480,local_454);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_720,&local_580,local_53c);
  local_588 = local_680;
  local_58c = local_684;
  local_2a0 = *(double **)(local_680 + 0x10);
  local_2a8 = (undefined8 *)(local_680 + 0x18);
  local_2ac = *(int *)(local_680 + 0x34);
  local_1fc = 0;
  local_27c = *(undefined4 *)local_2a8;
  local_20c = 1;
  uStack_278 = *(undefined4 *)(local_680 + 0x1c);
  local_2c8._0_8_ = *local_2a8;
  local_21c = 2;
  local_2c8.z = *(int *)(local_680 + 0x20);
  local_228 = (int *)(local_680 + 0x24);
  local_22c = 0;
  local_258 = *local_228 + 1;
  local_238 = local_680 + 0x24;
  local_23c = 1;
  iStack_254 = *(int *)(local_680 + 0x28) + 1;
  local_248 = local_680 + 0x24;
  local_24c = 2;
  local_2e8.z = *(int *)(local_680 + 0x2c) + 1;
  local_2e8.y = iStack_254;
  local_2e8.x = local_258;
  local_2d8._0_8_ = local_2e8._0_8_;
  local_2d8.z = local_2e8.z;
  local_2b8._0_8_ = local_2c8._0_8_;
  local_2b8.z = local_2c8.z;
  local_298._0_8_ = local_2c8._0_8_;
  local_298.z = local_2c8.z;
  local_288 = local_2a8;
  local_274 = local_2c8.z;
  local_270._0_8_ = local_2e8._0_8_;
  local_270.z = local_2e8.z;
  local_260 = local_2a8;
  local_250 = local_2e8.z;
  local_218 = local_2a8;
  local_208 = local_2a8;
  local_1f8 = local_2a8;
  amrex::Array4<double>::Array4(&local_5d0,local_2a0,&local_2b8,&local_2d8,local_2ac);
  amrex::Array4<double>::Array4<double,_0>(&local_760,&local_5d0,local_58c);
  local_5dc = local_684 + 0x15;
  local_5d8 = local_680;
  local_1a8 = *(double **)(local_680 + 0x10);
  local_1b0 = (undefined8 *)(local_680 + 0x18);
  local_1b4 = *(int *)(local_680 + 0x34);
  local_104 = 0;
  local_184 = *(undefined4 *)local_1b0;
  local_114 = 1;
  uStack_180 = *(undefined4 *)(local_680 + 0x1c);
  local_1d0._0_8_ = *local_1b0;
  local_124 = 2;
  local_1d0.z = *(int *)(local_680 + 0x20);
  local_130 = (int *)(local_680 + 0x24);
  local_134 = 0;
  local_160 = *local_130 + 1;
  local_140 = local_680 + 0x24;
  local_144 = 1;
  iStack_15c = *(int *)(local_680 + 0x28) + 1;
  local_150 = local_680 + 0x24;
  local_154 = 2;
  local_1f0.z = *(int *)(local_680 + 0x2c) + 1;
  local_1f0.y = iStack_15c;
  local_1f0.x = local_160;
  local_1e0._0_8_ = local_1f0._0_8_;
  local_1e0.z = local_1f0.z;
  local_1c0._0_8_ = local_1d0._0_8_;
  local_1c0.z = local_1d0.z;
  local_1a0._0_8_ = local_1d0._0_8_;
  local_1a0.z = local_1d0.z;
  local_190 = local_1b0;
  local_17c = local_1d0.z;
  local_178._0_8_ = local_1f0._0_8_;
  local_178.z = local_1f0.z;
  local_168 = local_1b0;
  local_158 = local_1f0.z;
  local_120 = local_1b0;
  local_110 = local_1b0;
  local_100 = local_1b0;
  amrex::Array4<double>::Array4(&local_620,local_1a8,&local_1c0,&local_1e0,local_1b4);
  amrex::Array4<double>::Array4<double,_0>(&local_7a0,&local_620,local_5dc);
  local_62c = local_684 + 0x16;
  local_628 = local_680;
  local_b0 = *(double **)(local_680 + 0x10);
  local_b8 = (undefined8 *)(local_680 + 0x18);
  local_bc = *(int *)(local_680 + 0x34);
  local_c = 0;
  local_8c = *(undefined4 *)local_b8;
  local_1c = 1;
  uStack_88 = *(undefined4 *)(local_680 + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_2c = 2;
  local_d8.z = *(int *)(local_680 + 0x20);
  local_38 = (int *)(local_680 + 0x24);
  local_3c = 0;
  local_68 = *local_38 + 1;
  local_48 = local_680 + 0x24;
  local_4c = 1;
  iStack_64 = *(int *)(local_680 + 0x28) + 1;
  local_58 = local_680 + 0x24;
  local_5c = 2;
  local_f8.z = *(int *)(local_680 + 0x2c) + 1;
  local_f8.y = iStack_64;
  local_f8.x = local_68;
  local_e4._0_8_ = local_f8._0_8_;
  local_e4.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_84 = local_d8.z;
  local_80._0_8_ = local_f8._0_8_;
  local_80.z = local_f8.z;
  local_70 = local_b8;
  local_60 = local_f8.z;
  local_28 = local_b8;
  local_18 = local_b8;
  local_8 = local_b8;
  amrex::Array4<double>::Array4(&local_670,local_b0,&local_c8,&local_e4,local_bc);
  amrex::Array4<double>::Array4<double,_0>(&local_7e0,&local_670,local_62c);
  local_7e8 = pele::physics::transport::TransportParams<pele::physics::transport::SimpleTransport>::
              device_trans_parm(&PeleLM::trans_parms);
  if (PeleLM::unity_Le == 0) {
    memcpy(local_a98,&local_6e0,0x3c);
    memcpy(auStack_a58,&local_720,0x3c);
    memcpy(auStack_a18,&local_760,0x3c);
    memcpy(auStack_9d8,&local_7a0,0x3c);
    memcpy(auStack_998,&local_7e0,0x3c);
    local_958 = local_7e8;
    amrex::
    ParallelFor<pelelm_dertransportcoeff(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__1>
              (in_stack_fffffffffffff590,(anon_class_328_6_344d177a *)in_stack_fffffffffffff588);
  }
  else {
    local_7f0 = 1.0 / PeleLM::schmidt;
    local_7f8 = 1.0 / PeleLM::prandtl;
    memcpy(local_950,&local_6e0,0x3c);
    memcpy(auStack_910,&local_720,0x3c);
    memcpy(auStack_8d0,&local_760,0x3c);
    memcpy(auStack_890,&local_7a0,0x3c);
    memcpy(auStack_850,&local_7e0,0x3c);
    local_810 = local_7f0;
    local_808 = local_7f8;
    local_800 = local_7e8;
    amrex::
    ParallelFor<pelelm_dertransportcoeff(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__0>
              (in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  }
  return;
}

Assistant:

void pelelm_dertransportcoeff (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == NUM_SPECIES+2);
    auto const T       = datfab.array(1);
    auto const rhoY    = datfab.array(2);
    auto       rhoD    = derfab.array(dcomp);
    auto       lambda  = derfab.array(dcomp+NUM_SPECIES);
    auto       mu      = derfab.array(dcomp+NUM_SPECIES+1);

    // Get the transport GPU data pointer
    auto const* ltransparm = PeleLM::trans_parms.device_trans_parm();
    if ( PeleLM::unity_Le ) {
      amrex::Real ScInv = 1.0/PeleLM::schmidt;
      amrex::Real PrInv = 1.0/PeleLM::prandtl;
      amrex::ParallelFor(bx,
			 [T, rhoY, rhoD, lambda, mu, ScInv, PrInv, ltransparm] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
	getTransportCoeffUnityLe( i, j, k, ScInv, PrInv, rhoY, T, rhoD, lambda, mu, ltransparm);
      });
    } else {
      amrex::ParallelFor(bx,
      [T, rhoY, rhoD, lambda, mu, ltransparm] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          getTransportCoeff( i, j, k, rhoY, T, rhoD, lambda, mu, ltransparm);
      });
    }

}